

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O0

TPM_RC TPM2_EncryptDecrypt(TSS_DEVICE *tpm,TSS_SESSION *session,TPMI_DH_OBJECT keyHandle,
                          TPMI_YES_NO decrypt,TPM_ALG_ID cipherMode,TPM2B_IV *ivIn,
                          TPM2B_MAX_BUFFER *inData,TPM2B_MAX_BUFFER *outData,TPM2B_IV *ivOut)

{
  UINT16 UVar1;
  TPM_RC TVar2;
  undefined1 local_30aa [8];
  TPM2B_IV val;
  void *p_4;
  void *p_3;
  void *p_2;
  void *p_1;
  void *p;
  BYTE *paramBuf;
  TSS_CMD_CONTEXT *pTStack_3060;
  INT32 sizeParamBuf;
  TSS_CMD_CONTEXT *cmdCtx;
  undefined1 local_3050 [4];
  TPM_RC cmdResult;
  TSS_CMD_CONTEXT CmdCtx;
  TPM2B_IV *ivIn_local;
  TPM_ALG_ID cipherMode_local;
  TPMI_YES_NO decrypt_local;
  TPMI_DH_OBJECT keyHandle_local;
  TSS_SESSION *session_local;
  TSS_DEVICE *tpm_local;
  
  cmdCtx._4_4_ = 0;
  pTStack_3060 = (TSS_CMD_CONTEXT *)local_3050;
  paramBuf._4_4_ = 0x1000;
  p = &cmdResult;
  local_3050 = (undefined1  [4])0x0;
  p_1 = (void *)((long)&ivIn_local + 3);
  CmdCtx._12312_8_ = ivIn;
  ivIn_local._0_2_ = cipherMode;
  ivIn_local._3_1_ = decrypt;
  ivIn_local._4_4_ = keyHandle;
  _cipherMode_local = session;
  session_local = (TSS_SESSION *)tpm;
  UVar1 = UINT8_Marshal((UINT8 *)((long)&ivIn_local + 3),(BYTE **)&p,(INT32 *)((long)&paramBuf + 4))
  ;
  pTStack_3060->ParamSize = (uint)UVar1 + pTStack_3060->ParamSize;
  p_2 = &ivIn_local;
  UVar1 = UINT16_Marshal((UINT16 *)&ivIn_local,(BYTE **)&p,(INT32 *)((long)&paramBuf + 4));
  pTStack_3060->ParamSize = (uint)UVar1 + pTStack_3060->ParamSize;
  if (CmdCtx._12312_8_ == 0) {
    p_4 = &NullSize;
    UVar1 = UINT16_Marshal(&NullSize,(BYTE **)&p,(INT32 *)((long)&paramBuf + 4));
    pTStack_3060->ParamSize = (uint)UVar1 + pTStack_3060->ParamSize;
  }
  else {
    p_3 = (void *)CmdCtx._12312_8_;
    UVar1 = TPM2B_IV_Marshal((TPM2B_IV *)CmdCtx._12312_8_,(BYTE **)&p,(INT32 *)((long)&paramBuf + 4)
                            );
    pTStack_3060->ParamSize = (uint)UVar1 + pTStack_3060->ParamSize;
  }
  val._10_8_ = inData;
  UVar1 = TPM2B_MAX_BUFFER_Marshal(inData,(BYTE **)&p,(INT32 *)((long)&paramBuf + 4));
  pTStack_3060->ParamSize = (uint)UVar1 + pTStack_3060->ParamSize;
  cmdCtx._4_4_ = TSS_DispatchCmd((TSS_DEVICE *)session_local,0x164,
                                 (TPM_HANDLE *)((long)&ivIn_local + 4),1,
                                 (TSS_SESSION **)&cipherMode_local,1,pTStack_3060);
  tpm_local._4_4_ = cmdCtx._4_4_;
  if (cmdCtx._4_4_ == 0) {
    TVar2 = TPM2B_MAX_BUFFER_Unmarshal
                      (outData,&pTStack_3060->RespBufPtr,(INT32 *)&pTStack_3060->RespBytesLeft);
    if (TVar2 == 0) {
      if (ivOut == (TPM2B_IV *)0x0) {
        TVar2 = TPM2B_IV_Unmarshal((TPM2B_IV *)local_30aa,&pTStack_3060->RespBufPtr,
                                   (INT32 *)&pTStack_3060->RespBytesLeft);
        if (TVar2 != 0) {
          return 0x9a;
        }
      }
      else {
        TVar2 = TPM2B_IV_Unmarshal(ivOut,&pTStack_3060->RespBufPtr,
                                   (INT32 *)&pTStack_3060->RespBytesLeft);
        if (TVar2 != 0) {
          return 0x9a;
        }
      }
      tpm_local._4_4_ = cmdCtx._4_4_;
    }
    else {
      tpm_local._4_4_ = 0x9a;
    }
  }
  return tpm_local._4_4_;
}

Assistant:

TPM_RC
TPM2_EncryptDecrypt(
    TSS_DEVICE             *tpm,                // IN/OUT
    TSS_SESSION            *session,            // IN/OUT
    TPMI_DH_OBJECT          keyHandle,          // IN
    TPMI_YES_NO             decrypt,            // IN
    TPM_ALG_ID              cipherMode,         // IN
    TPM2B_IV               *ivIn,               // IN [opt]
    TPM2B_MAX_BUFFER       *inData,             // IN
    TPM2B_MAX_BUFFER       *outData,            // OUT
    TPM2B_IV               *ivOut               // OUT [opt]
)
{
    TSS_CMD_CONTEXT  CmdCtx;

    BEGIN_CMD();
    TSS_MARSHAL(TPMI_YES_NO, &decrypt);
    TSS_MARSHAL(TPM_ALG_ID, &cipherMode);
    TSS_MARSHAL_OPT2B(TPM2B_IV, ivIn);
    TSS_MARSHAL(TPM2B_MAX_BUFFER, inData);
    DISPATCH_CMD(EncryptDecrypt, &keyHandle, 1, &session, 1);
    TSS_UNMARSHAL(TPM2B_MAX_BUFFER, outData);
    TSS_UNMARSHAL_OPT(TPM2B_IV, ivOut);
    END_CMD();
}